

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

DecodeStatus DecodeBranchImmInstruction(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  MCInst *pMVar1;
  _Bool _Var2;
  uint32_t uVar3;
  uint32_t uVar4;
  int32_t iVar5;
  DecodeStatus In;
  uint imm;
  uint pred;
  DecodeStatus S;
  void *Decoder_local;
  uint64_t Address_local;
  MCInst *pMStack_18;
  uint Insn_local;
  MCInst *Inst_local;
  
  imm = 3;
  _pred = Decoder;
  Decoder_local = (void *)Address;
  Address_local._4_4_ = Insn;
  pMStack_18 = Inst;
  uVar3 = fieldFromInstruction_4(Insn,0x1c,4);
  uVar4 = fieldFromInstruction_4(Address_local._4_4_,0,0x18);
  pMVar1 = pMStack_18;
  if (uVar3 == 0xf) {
    MCInst_setOpcode(pMStack_18,0x3b);
    uVar3 = fieldFromInstruction_4(Address_local._4_4_,0x18,1);
    pMVar1 = pMStack_18;
    iVar5 = SignExtend32(uVar3 << 1 | uVar4 << 2,0x1a);
    MCOperand_CreateImm0(pMVar1,(long)iVar5);
    Inst_local._4_4_ = imm;
  }
  else {
    iVar5 = SignExtend32(uVar4 << 2,0x1a);
    MCOperand_CreateImm0(pMVar1,(long)iVar5);
    In = DecodePredicateOperand(pMStack_18,uVar3,(uint64_t)Decoder_local,_pred);
    _Var2 = Check(&imm,In);
    if (_Var2) {
      Inst_local._4_4_ = imm;
    }
    else {
      Inst_local._4_4_ = MCDisassembler_Fail;
    }
  }
  return Inst_local._4_4_;
}

Assistant:

static DecodeStatus DecodeBranchImmInstruction(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;

	unsigned pred = fieldFromInstruction_4(Insn, 28, 4);
	unsigned imm = fieldFromInstruction_4(Insn, 0, 24) << 2;

	if (pred == 0xF) {
		MCInst_setOpcode(Inst, ARM_BLXi);
		imm |= fieldFromInstruction_4(Insn, 24, 1) << 1;
		MCOperand_CreateImm0(Inst, SignExtend32(imm, 26));
		return S;
	}

	MCOperand_CreateImm0(Inst, SignExtend32(imm, 26));
	if (!Check(&S, DecodePredicateOperand(Inst, pred, Address, Decoder)))
		return MCDisassembler_Fail;

	return S;
}